

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

size_t __thiscall pbrt::PiecewiseConstant2D::BytesUsed(PiecewiseConstant2D *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  PiecewiseConstant1D *in_RDI;
  
  sVar1 = pstd::
          vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
          ::size((vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
                  *)&(in_RDI->func).nAlloc);
  pstd::
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>::
  operator[]((vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
              *)&(in_RDI->func).nAlloc,0);
  sVar2 = PiecewiseConstant1D::BytesUsed(in_RDI);
  sVar3 = PiecewiseConstant1D::BytesUsed(in_RDI);
  return sVar1 * (sVar2 + 0x50) + sVar3;
}

Assistant:

PBRT_CPU_GPU
    size_t BytesUsed() const {
        return pConditionalY.size() *
                   (pConditionalY[0].BytesUsed() + sizeof(pConditionalY[0])) +
               pMarginal.BytesUsed();
    }